

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O3

size_t __thiscall
VulkanHppGenerator::determineInitialSkipCount(VulkanHppGenerator *this,string *command)

{
  const_iterator cVar1;
  const_iterator cVar2;
  const_iterator cVar3;
  size_t sVar4;
  _Rb_tree_header *p_Var5;
  
  cVar1 = anon_unknown.dwarf_18c225::findByNameOrAlias<VulkanHppGenerator::CommandData>
                    (&this->m_commands,command);
  if ((_Rb_tree_header *)cVar1._M_node == &(this->m_commands)._M_t._M_impl.super__Rb_tree_header) {
    __assert_fail("commandIt != m_commands.end()",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                  ,0x673,
                  "size_t VulkanHppGenerator::determineInitialSkipCount(const std::string &) const")
    ;
  }
  cVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::HandleData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::HandleData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::HandleData>_>_>
          ::find(&(this->m_handles)._M_t,(key_type *)&cVar1._M_node[4]._M_parent);
  p_Var5 = &(this->m_handles)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)cVar2._M_node == p_Var5) {
    __assert_fail("handleIt != m_handles.end()",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                  ,0x675,
                  "size_t VulkanHppGenerator::determineInitialSkipCount(const std::string &) const")
    ;
  }
  cVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find(cVar2._M_node + 5,command);
  if (cVar3._M_node == (_Base_ptr)&cVar2._M_node[5]._M_parent) {
    if ((ulong)(((long)cVar1._M_node[5]._M_left - (long)cVar1._M_node[5]._M_parent >> 3) *
               0xf83e0f83e0f83e1) < 2) {
      __assert_fail("1 < commandIt->second.params.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                    ,0x678,
                    "size_t VulkanHppGenerator::determineInitialSkipCount(const std::string &) const"
                   );
    }
    cVar2 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::HandleData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::HandleData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::HandleData>_>_>
            ::find(&(this->m_handles)._M_t,(key_type *)&cVar1._M_node[5]._M_parent[9]._M_parent);
    sVar4 = 2;
    if ((_Rb_tree_header *)cVar2._M_node == p_Var5) {
      __assert_fail("m_handles.contains( commandIt->second.params[1].type.type )",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                    ,0x679,
                    "size_t VulkanHppGenerator::determineInitialSkipCount(const std::string &) const"
                   );
    }
  }
  else {
    sVar4 = (size_t)(cVar2._M_node[1]._M_parent != (_Base_ptr)0x0);
  }
  return sVar4;
}

Assistant:

size_t VulkanHppGenerator::determineInitialSkipCount( std::string const & command ) const
{
  // determine the number of arguments to skip for a function
  // -> 0: the command is not bound to an instance or a device (the corresponding handle has no name)
  // -> 1: the command bound to an instance or a device (the corresponding handle has a name)
  // -> 2: the command has been moved to a second handle
  auto commandIt = findByNameOrAlias( m_commands, command );
  assert( commandIt != m_commands.end() );
  auto handleIt = m_handles.find( commandIt->second.handle );
  assert( handleIt != m_handles.end() );
  if ( !handleIt->second.commands.contains( command ) )
  {
    assert( 1 < commandIt->second.params.size() );
    assert( m_handles.contains( commandIt->second.params[1].type.type ) );
    return 2;
  }
  else
  {
    return handleIt->first.empty() ? 0 : 1;
  }
}